

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

pointer __thiscall
slang::SmallVectorBase<slang::parsing::TokenKind>::emplaceRealloc<slang::parsing::TokenKind_const&>
          (SmallVectorBase<slang::parsing::TokenKind> *this,pointer pos,TokenKind *args)

{
  size_type sVar1;
  size_type sVar2;
  size_type capacity;
  iterator pTVar3;
  TokenKind *__result;
  TokenKind *pTVar4;
  EVP_PKEY_CTX *ctx;
  pointer newPos;
  pointer newData;
  size_type offset;
  size_type newCap;
  TokenKind *args_local;
  pointer pos_local;
  SmallVectorBase<slang::parsing::TokenKind> *this_local;
  
  sVar1 = this->len;
  sVar2 = max_size(this);
  if (sVar1 == sVar2) {
    slang::detail::throwLengthError();
  }
  capacity = calculateGrowth(this,this->len + 1);
  pTVar3 = begin(this);
  __result = (TokenKind *)slang::detail::allocArray(capacity,2);
  pTVar4 = __result + ((long)pos - (long)pTVar3 >> 1);
  *pTVar4 = *args;
  pTVar3 = end(this);
  if (pos == pTVar3) {
    pTVar3 = begin(this);
    ctx = (EVP_PKEY_CTX *)end(this);
    std::uninitialized_move<slang::parsing::TokenKind*,slang::parsing::TokenKind*>
              (pTVar3,(TokenKind *)ctx,__result);
  }
  else {
    pTVar3 = begin(this);
    std::uninitialized_move<slang::parsing::TokenKind*,slang::parsing::TokenKind*>
              (pTVar3,pos,__result);
    ctx = (EVP_PKEY_CTX *)end(this);
    std::uninitialized_move<slang::parsing::TokenKind*,slang::parsing::TokenKind*>
              (pos,(TokenKind *)ctx,pTVar4 + 1);
  }
  cleanup(this,ctx);
  this->len = this->len + 1;
  this->cap = capacity;
  this->data_ = __result;
  return pTVar4;
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)detail::allocArray(newCap, sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}